

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

QString * fileArchitecture(Options *options,QString *path)

{
  QLatin1StringView str;
  QAnyStringView s;
  QAnyStringView s_00;
  QByteArrayView bv;
  bool bVar1;
  ulong uVar2;
  char *pcVar3;
  FILE *pFVar4;
  QString *in_RDI;
  long in_FS_OFFSET;
  const_iterator it;
  QByteArray line;
  UP readElfCommand;
  QString readElf;
  QString arch;
  char buffer [512];
  ArgBase *argBases [3];
  QString *in_stack_fffffffffffffb88;
  QString *this;
  QString *in_stack_fffffffffffffb90;
  QAnyStringView *in_stack_fffffffffffffb98;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 in_stack_fffffffffffffba0;
  QString *pQVar5;
  undefined4 in_stack_fffffffffffffbb8;
  undefined4 in_stack_fffffffffffffbbc;
  int iVar6;
  undefined1 local_3e0 [24];
  piter local_3c8;
  undefined8 local_390;
  undefined8 local_388;
  undefined8 local_380;
  undefined8 local_360;
  QLatin1StringView local_328;
  undefined1 local_318 [48];
  QString local_2e8;
  undefined8 local_2d0;
  undefined8 local_2c8;
  undefined8 local_2c0;
  undefined1 local_2a8 [40];
  undefined1 local_280 [24];
  qsizetype local_268;
  char *local_260;
  ulong local_258;
  ArgBase **local_250;
  ulong local_248;
  ArgBase **local_240;
  ulong local_238;
  ArgBase **local_230;
  QString local_228 [21];
  undefined1 *local_28;
  undefined1 *local_20;
  undefined8 local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_2d0 = 0xaaaaaaaaaaaaaaaa;
  local_2c8 = 0xaaaaaaaaaaaaaaaa;
  local_2c0 = 0xaaaaaaaaaaaaaaaa;
  pQVar5 = in_RDI;
  architectureFromName(in_RDI);
  bVar1 = QString::isEmpty((QString *)0x1097d4);
  if (bVar1) {
    local_2e8.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_2e8.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
    local_2e8.d.size = -0x5555555555555556;
    llvmReadobjPath((Options *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
    uVar2 = QFile::exists((QString *)&local_2e8);
    if ((uVar2 & 1) == 0) {
      pFVar4 = _stderr;
      QtPrivate::asString(&local_2e8);
      QString::toLocal8Bit(in_RDI);
      pcVar3 = QByteArray::constData((QByteArray *)0x109880);
      fprintf(pFVar4,"Command does not exist: %s\n",pcVar3);
      QByteArray::~QByteArray((QByteArray *)0x1098a3);
      QString::QString((QString *)0x1098ad);
    }
    else {
      local_328 = Qt::Literals::StringLiterals::operator____L1
                            ((char *)in_stack_fffffffffffffb98,(size_t)in_stack_fffffffffffffb90);
      shellQuote((QString *)in_stack_fffffffffffffb98);
      shellQuote((QString *)in_stack_fffffffffffffb98);
      local_268 = local_328.m_size;
      local_260 = local_328.m_data;
      str.m_data = (char *)in_RDI;
      str.m_size = (qsizetype)in_stack_fffffffffffffba0.m_data;
      QAnyStringView::QAnyStringView(in_stack_fffffffffffffb98,str);
      QAnyStringView::QAnyStringView
                ((QAnyStringView *)in_stack_fffffffffffffba0.m_data,
                 (QString *)in_stack_fffffffffffffb98);
      s.m_size = (size_t)in_RDI;
      s.field_0.m_data = in_stack_fffffffffffffba0.m_data;
      QtPrivate::qStringLikeToArg(s);
      QAnyStringView::QAnyStringView
                ((QAnyStringView *)in_stack_fffffffffffffba0.m_data,
                 (QString *)in_stack_fffffffffffffb98);
      s_00.m_size = (size_t)in_RDI;
      s_00.field_0.m_data = in_stack_fffffffffffffba0.m_data;
      QtPrivate::qStringLikeToArg(s_00);
      local_238 = local_258;
      local_230 = local_250;
      local_28 = local_280;
      local_20 = local_2a8;
      local_18 = 0;
      local_248 = local_258;
      local_240 = local_250;
      QtPrivate::argToQString((QAnyStringView *)local_318,local_258,local_250);
      QString::operator=(in_stack_fffffffffffffb90,in_stack_fffffffffffffb88);
      QString::~QString((QString *)0x109ad6);
      QString::~QString((QString *)0x109ae3);
      QString::~QString((QString *)0x109af0);
      local_360 = 0xaaaaaaaaaaaaaaaa;
      openProcess(in_RDI);
      bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr<_IO_FILE,_Closer> *)0x109b21);
      if (bVar1) {
        memset(local_228,0xaa,0x200);
        while( true ) {
          in_stack_fffffffffffffb90 = local_228;
          pFVar4 = (FILE *)std::unique_ptr<_IO_FILE,_Closer>::get
                                     ((unique_ptr<_IO_FILE,_Closer> *)0x109bc9);
          pcVar3 = fgets((char *)in_stack_fffffffffffffb90,0x200,pFVar4);
          if (pcVar3 == (char *)0x0) break;
          local_390 = 0xaaaaaaaaaaaaaaaa;
          local_388 = 0xaaaaaaaaaaaaaaaa;
          local_380 = 0xaaaaaaaaaaaaaaaa;
          this = local_228;
          qstrlen((char *)in_stack_fffffffffffffb90);
          QByteArray::fromRawData((char *)in_RDI,(qsizetype)in_stack_fffffffffffffba0);
          QByteArray::trimmed((QByteArray *)this);
          QByteArray::operator=((QByteArray *)in_stack_fffffffffffffb90,(QByteArray *)this);
          QByteArray::~QByteArray((QByteArray *)0x109c76);
          QByteArrayView::QByteArrayView<7ul>
                    ((QByteArrayView *)in_stack_fffffffffffffba0.m_data,
                     (char (*) [7])in_stack_fffffffffffffb98);
          bv.m_data._0_4_ = in_stack_fffffffffffffbb8;
          bv.m_size = (qsizetype)pQVar5;
          bv.m_data._4_4_ = in_stack_fffffffffffffbbc;
          bVar1 = QByteArray::startsWith((QByteArray *)in_stack_fffffffffffffb98,bv);
          if (bVar1) {
            local_3c8.bucket = 0xaaaaaaaaaaaaaaaa;
            local_3c8.d = (Data<QHashPrivate::Node<QByteArray,_QByteArray>_> *)0xaaaaaaaaaaaaaaaa;
            QByteArray::mid((longlong)local_3e0,(longlong)&local_390);
            local_3c8 = (piter)QHash<QByteArray,_QByteArray>::find
                                         ((QHash<QByteArray,_QByteArray> *)in_stack_fffffffffffffb90
                                          ,(QByteArray *)this);
            QByteArray::~QByteArray((QByteArray *)0x109d20);
            QHash<QByteArray,_QByteArray>::constEnd
                      ((QHash<QByteArray,_QByteArray> *)in_stack_fffffffffffffb98);
            bVar1 = QHash<QByteArray,_QByteArray>::const_iterator::operator!=
                              ((const_iterator *)in_stack_fffffffffffffb98,
                               (const_iterator *)in_stack_fffffffffffffb90);
            if (bVar1) {
              QHash<QByteArray,_QByteArray>::const_iterator::value((const_iterator *)0x109d64);
              QString::fromLatin1<void>((QByteArray *)in_stack_fffffffffffffb90);
            }
            else {
              QString::QString((QString *)0x109d7d);
            }
            iVar6 = 1;
          }
          else {
            iVar6 = 0;
          }
          QByteArray::~QByteArray((QByteArray *)0x109d9c);
          if (iVar6 != 0) goto LAB_00109dbd;
          in_stack_fffffffffffffbbc = 0;
        }
        QString::QString((QString *)0x109db5);
      }
      else {
        pFVar4 = _stderr;
        QtPrivate::asString(&local_2e8);
        QString::toLocal8Bit(in_RDI);
        pcVar3 = QByteArray::constData((QByteArray *)0x109b5e);
        fprintf(pFVar4,"Cannot execute command %s\n",pcVar3);
        QByteArray::~QByteArray((QByteArray *)0x109b81);
        QString::QString((QString *)0x109b8b);
      }
LAB_00109dbd:
      std::unique_ptr<_IO_FILE,_Closer>::~unique_ptr
                ((unique_ptr<_IO_FILE,_Closer> *)in_stack_fffffffffffffb90);
    }
    QString::~QString((QString *)0x109dd7);
  }
  else {
    QString::QString(in_stack_fffffffffffffb90,in_stack_fffffffffffffb88);
  }
  QString::~QString((QString *)0x109de4);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return pQVar5;
  }
  __stack_chk_fail();
}

Assistant:

QString fileArchitecture(const Options &options, const QString &path)
{
    auto arch = architectureFromName(path);
    if (!arch.isEmpty())
        return arch;

    QString readElf = llvmReadobjPath(options);
    if (!QFile::exists(readElf)) {
        fprintf(stderr, "Command does not exist: %s\n", qPrintable(readElf));
        return {};
    }

    readElf = "%1 --needed-libs %2"_L1.arg(shellQuote(readElf), shellQuote(path));

    auto readElfCommand = openProcess(readElf);
    if (!readElfCommand) {
        fprintf(stderr, "Cannot execute command %s\n", qPrintable(readElf));
        return {};
    }

    char buffer[512];
    while (fgets(buffer, sizeof(buffer), readElfCommand.get()) != nullptr) {
        QByteArray line = QByteArray::fromRawData(buffer, qstrlen(buffer));
        line = line.trimmed();
        if (line.startsWith("Arch: ")) {
            auto it = elfArchitectures.find(line.mid(6));
            return it != elfArchitectures.constEnd() ? QString::fromLatin1(it.value()) : QString{};
        }
    }
    return {};
}